

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

word Gia_LutComputeTruth6Map_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vMap)

{
  Gia_Obj_t *pGVar1;
  long lVar2;
  uint uVar3;
  word wVar4;
  word wVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((-1 < iObj) && (iObj < p->nObjs)) {
    uVar6 = *(ulong *)(p->pObjs + (uint)iObj);
    if ((~uVar6 & 0x1fffffff1fffffff) == 0) {
      wVar4 = 0;
    }
    else if ((~(uint)uVar6 & 0x9fffffff) == 0) {
      uVar3 = (uint)(uVar6 >> 0x20);
      if (vMap->nSize <= (int)(uVar3 & 0x1fffffff)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      wVar4 = s_Truths6[vMap->pArray[uVar3 & 0x1fffffff]];
    }
    else {
      pGVar1 = p->pObjs + (uint)iObj;
      wVar4 = Gia_LutComputeTruth6Map_rec(p,iObj - ((uint)uVar6 & 0x1fffffff),vMap);
      wVar5 = Gia_LutComputeTruth6Map_rec(p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),vMap);
      lVar2 = *(long *)pGVar1;
      uVar3 = (uint)lVar2;
      uVar6 = (long)((int)(uVar3 * 4) >> 0x1f) ^ wVar4;
      uVar7 = lVar2 * 4 >> 0x3f ^ wVar5;
      wVar4 = uVar6 & uVar7;
      if (((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) &&
          (uVar3 & 0x1fffffff) < ((uint)((ulong)lVar2 >> 0x20) & 0x1fffffff)) {
        wVar4 = uVar6 ^ uVar7;
      }
    }
    return wVar4;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

word Gia_LutComputeTruth6Map_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vMap )
{
    word Truth0, Truth1, Truth;
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( Gia_ObjIsConst0(pObj) )
        return 0;
    if ( Gia_ObjIsCi(pObj) )
        return s_Truths6[Vec_IntEntry(vMap, Gia_ObjCioId(pObj))];
    Truth0 = Gia_LutComputeTruth6Map_rec( p, Gia_ObjFaninId0(pObj, iObj), vMap );
    Truth1 = Gia_LutComputeTruth6Map_rec( p, Gia_ObjFaninId1(pObj, iObj), vMap );
    Truth0 = Gia_ObjFaninC0(pObj) ? ~Truth0 : Truth0;
    Truth1 = Gia_ObjFaninC1(pObj) ? ~Truth1 : Truth1;
    Truth  = Gia_ObjIsXor(pObj) ? Truth0 ^ Truth1 : Truth0 & Truth1;
    return Truth;
}